

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> __thiscall
jbcoin::Logs::makeSink(Logs *this,string *name,Severity threshold)

{
  undefined4 in_register_00000014;
  undefined1 local_1c [12];
  
  std::
  make_unique<jbcoin::Logs::Sink,std::__cxx11::string_const&,beast::severities::Severity&,jbcoin::Logs&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1c + 4),
             (Severity *)CONCAT44(in_register_00000014,threshold),(Logs *)local_1c);
  this->_vptr_Logs = (_func_int **)local_1c._4_8_;
  return (__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
          )(__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<beast::Journal::Sink>
Logs::makeSink(std::string const& name,
    beast::severities::Severity threshold)
{
    return std::make_unique<Sink>(
        name, threshold, *this);
}